

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

void tb_invalidate_phys_range_tricore(uc_struct_conflict15 *uc,ram_addr_t start,ram_addr_t end)

{
  page_collection *mem;
  ulong uVar1;
  PageDesc *pages;
  ram_addr_t start_00;
  tb_page_addr_t in_R8;
  uintptr_t in_R9;
  long lVar2;
  
  mem = page_collection_lock_tricore(uc,start,end);
  if (end != start && -1 < (long)(end - start)) {
    uVar1 = (ulong)((uint)start & 0xffffc000);
    lVar2 = end - uVar1;
    do {
      uVar1 = uVar1 + 0x4000;
      pages = page_find_alloc(uc,start >> 0xe,0);
      if (pages != (PageDesc *)0x0) {
        start_00 = end;
        if (uVar1 < end) {
          start_00 = uVar1;
        }
        tb_invalidate_phys_page_range__locked
                  (uc,(page_collection *)pages,(PageDesc *)start,start_00,in_R8,in_R9);
      }
      lVar2 = lVar2 + -0x4000;
      start = uVar1;
    } while (0 < lVar2);
  }
  g_tree_destroy(mem->tree);
  g_free(mem);
  return;
}

Assistant:

void tb_invalidate_phys_range(struct uc_struct *uc, ram_addr_t start, ram_addr_t end)
{
    struct page_collection *pages;
    tb_page_addr_t next;

    assert_memory_lock();

    pages = page_collection_lock(uc, start, end);
    for (next = (start & TARGET_PAGE_MASK) + TARGET_PAGE_SIZE;
         //start < end; Unicorn: Fix possible wrap around
         (intptr_t)(end - start) > 0;
         start = next, next += TARGET_PAGE_SIZE) {
        PageDesc *pd = page_find(uc, start >> TARGET_PAGE_BITS);
        tb_page_addr_t bound = MIN(next, end);

        if (pd == NULL) {
            continue;
        }
        tb_invalidate_phys_page_range__locked(uc, pages, pd, start, bound, 0);
    }
    page_collection_unlock(pages);
}